

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O3

void __thiscall
duckdb::CheckpointReader::ReadIndex
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer)

{
  shared_ptr<duckdb::DataTableInfo,_true> *this_00;
  Catalog *this_01;
  pointer pIVar1;
  _func_int *__n;
  CatalogTransaction transaction_00;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  pointer pCVar7;
  _func_int **pp_Var8;
  pointer pCVar9;
  SchemaCatalogEntry *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DataTableInfo *pDVar10;
  type args_2;
  IOException *this_03;
  pointer pIVar11;
  BlockPointer BVar12;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> ptr;
  optional_ptr<duckdb::CatalogEntry,_true> catalog_table;
  UnboundIndex *local_118;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_110;
  _Head_base<0UL,_duckdb::Index_*,_false> local_108;
  optional_ptr<duckdb::CatalogEntry,_true> local_100;
  DatabaseInstance *local_f8;
  ClientContext *pCStack_f0;
  Transaction *local_e8;
  transaction_t tStack_e0;
  transaction_t local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [24];
  undefined1 local_a8 [40];
  size_t local_80;
  _Alloc_hider _Stack_78;
  undefined1 local_70 [24];
  undefined1 auStack_58 [24];
  BlockPointer local_40;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"index");
  local_110._M_head_impl = (CreateInfo *)0x0;
  iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
  if ((char)iVar4 != '\0') {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    CreateInfo::Deserialize((CreateInfo *)local_d0,deserializer);
    local_110._M_head_impl = (CreateInfo *)local_d0._0_8_;
    (*deserializer->_vptr_Deserializer[7])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[0xb])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pCVar7 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)&local_110);
  uVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"root_block_pointer");
  pp_Var8 = deserializer->_vptr_Deserializer;
  if ((char)uVar5 == '\0') {
    BVar12 = (BlockPointer)ZEXT816(0xffffffffffffffff);
  }
  else {
    (*pp_Var8[6])(deserializer);
    BVar12 = BlockPointer::Deserialize(deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    pp_Var8 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var8[5])(deserializer,(ulong)(uVar5 & 0xff));
  this_01 = this->catalog;
  local_d8 = transaction.start_time;
  local_f8 = (DatabaseInstance *)transaction.db.ptr;
  pCStack_f0 = (ClientContext *)transaction.context.ptr;
  local_e8 = (Transaction *)transaction.transaction.ptr;
  tStack_e0 = transaction.transaction_id;
  pCVar9 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)&local_110);
  transaction_00.context.ptr._0_4_ = (int)pCStack_f0;
  transaction_00.db.ptr = local_f8;
  transaction_00.context.ptr._4_4_ = (int)((ulong)pCStack_f0 >> 0x20);
  transaction_00.transaction.ptr._0_4_ = (int)local_e8;
  transaction_00.transaction.ptr._4_4_ = (int)((ulong)local_e8 >> 0x20);
  transaction_00.transaction_id._0_4_ = (int)tStack_e0;
  transaction_00.transaction_id._4_4_ = (int)(tStack_e0 >> 0x20);
  transaction_00.start_time = local_d8;
  this_02 = Catalog::GetSchema(this_01,transaction_00,&pCVar9->schema);
  local_100 = SchemaCatalogEntry::GetEntry(this_02,transaction,TABLE_ENTRY,(string *)(pCVar7 + 1));
  if (local_100.ptr == (CatalogEntry *)0x0) {
    this_03 = (IOException *)__cxa_allocate_exception(0x10);
    local_d0._0_8_ = local_c0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"corrupt database file - index entry without table entry","");
    IOException::IOException(this_03,(string *)local_d0);
    __cxa_throw(this_03,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_100);
  oVar2.ptr = local_100.ptr;
  if (pCVar7[1].dependencies.set._M_h._M_bucket_count == 0) {
    ::std::__cxx11::string::_M_replace((ulong)&pCVar7[1].dependencies,0,(char *)0x0,0x1385a93);
  }
  iVar4 = (*(this_02->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x12])
                    (this_02,pCVar7,oVar2.ptr);
  local_d0._0_8_ = CONCAT44(extraout_var,iVar4);
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CatalogEntry,_true> *)local_d0);
  uVar3 = local_d0._0_8_;
  iVar4 = (*(oVar2.ptr)->_vptr_CatalogEntry[0x10])(oVar2.ptr);
  this_00 = (shared_ptr<duckdb::DataTableInfo,_true> *)(CONCAT44(extraout_var_00,iVar4) + 0x18);
  local_d0._0_8_ = local_c0;
  local_d0._8_8_ = 0;
  local_c0[0] = '\0';
  local_a8._0_8_ = &_Stack_78;
  local_a8._8_8_ = &DAT_00000001;
  local_a8._16_8_ = (_Hash_node_base *)0x0;
  local_a8._24_8_ = 0;
  local_a8._32_4_ = 0x3f800000;
  local_80 = 0;
  _Stack_78._M_p = (pointer)0x0;
  local_70._0_8_ = (pointer)0x0;
  local_70._8_8_ = 0;
  local_70._16_8_ = 0;
  auStack_58._0_8_ = (pointer)0x0;
  auStack_58._8_8_ = 0;
  auStack_58._16_8_ = (_Hash_node_base *)0x0;
  local_40 = (BlockPointer)ZEXT816(0xffffffffffffffff);
  if (BVar12.block_id == -1) {
    pDVar10 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_00);
    pIVar11 = (pDVar10->index_storage_infos).
              super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
              super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar1 = (pDVar10->index_storage_infos).
             super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
             super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar11 != pIVar1) {
      __n = *(_func_int **)(uVar3 + 0x28);
      do {
        if (((_func_int *)(pIVar11->name)._M_string_length == __n) &&
           ((__n == (_func_int *)0x0 ||
            (iVar6 = bcmp((pIVar11->name)._M_dataplus._M_p,
                          (((string *)(uVar3 + 0x20))->_M_dataplus)._M_p,(size_t)__n), iVar6 == 0)))
           ) {
          ::std::__cxx11::string::_M_assign((string *)local_d0);
          local_c0._16_8_ = pIVar11->root;
          if (pIVar11 != (pointer)local_d0) {
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_a8,&(pIVar11->options)._M_h);
          }
          ::std::
          vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
          operator=((vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                     *)local_70,
                    &(pIVar11->allocator_infos).
                     super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                   );
          ::std::
          vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
          ::operator=((vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
                       *)auStack_58,
                      &(pIVar11->buffers).
                       super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
                     );
          local_40 = pIVar11->root_block_ptr;
          break;
        }
        pIVar11 = pIVar11 + 1;
      } while (pIVar11 != pIVar1);
    }
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)local_d0);
    local_40 = BVar12;
  }
  pDVar10 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_00);
  args_2 = shared_ptr<duckdb::TableIOManager,_true>::operator*(&pDVar10->table_io_manager);
  make_uniq<duckdb::UnboundIndex,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::IndexStorageInfo&,duckdb::TableIOManager&,duckdb::AttachedDatabase&>
            ((duckdb *)&local_118,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             &local_110,(IndexStorageInfo *)local_d0,args_2,
             *(AttachedDatabase **)(CONCAT44(extraout_var_00,iVar4) + 0x10));
  pDVar10 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_00);
  local_108._M_head_impl = &local_118->super_Index;
  local_118 = (UnboundIndex *)0x0;
  TableIndexList::AddIndex
            (&pDVar10->indexes,
             (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)&local_108);
  if (local_108._M_head_impl != (Index *)0x0) {
    (*(local_108._M_head_impl)->_vptr_Index[1])();
  }
  local_108._M_head_impl = (Index *)0x0;
  if (local_118 != (UnboundIndex *)0x0) {
    ::std::default_delete<duckdb::UnboundIndex>::operator()
              ((default_delete<duckdb::UnboundIndex> *)&local_118,local_118);
  }
  ::std::
  vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ::~vector((vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
             *)auStack_58);
  ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
  ~vector((vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_> *
          )local_70);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_a8);
  if ((CatalogEntry *)local_d0._0_8_ != (CatalogEntry *)local_c0) {
    operator_delete((void *)local_d0._0_8_);
  }
  if (local_110._M_head_impl != (CreateInfo *)0x0) {
    (*((local_110._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return;
}

Assistant:

void CheckpointReader::ReadIndex(CatalogTransaction transaction, Deserializer &deserializer) {
	// we need to keep the tag "index", even though it is slightly misleading.
	auto create_info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(100, "index");
	auto &info = create_info->Cast<CreateIndexInfo>();

	// also, we have to read the root_block_pointer, which will not be valid for newer storage versions.
	// This leads to different code paths in this function.
	auto root_block_pointer =
	    deserializer.ReadPropertyWithExplicitDefault<BlockPointer>(101, "root_block_pointer", BlockPointer());

	// create the index in the catalog

	// look for the table in the catalog
	auto &schema = catalog.GetSchema(transaction, create_info->schema);
	auto catalog_table = schema.GetEntry(transaction, CatalogType::TABLE_ENTRY, info.table);
	if (!catalog_table) {
		// See internal issue 3663.
		throw IOException("corrupt database file - index entry without table entry");
	}
	auto &table = catalog_table->Cast<DuckTableEntry>();

	// we also need to make sure the index type is loaded
	// backwards compatibility:
	// if the index type is not specified, we default to ART
	if (info.index_type.empty()) {
		info.index_type = ART::TYPE_NAME;
	}

	// now we can look for the index in the catalog and assign the table info
	auto &index = schema.CreateIndex(transaction, info, table)->Cast<DuckIndexEntry>();
	auto &data_table = table.GetStorage();
	auto &table_info = data_table.GetDataTableInfo();

	IndexStorageInfo index_storage_info;
	if (root_block_pointer.IsValid()) {
		// Read older duckdb files.
		index_storage_info.name = index.name;
		index_storage_info.root_block_ptr = root_block_pointer;

	} else {
		// Read the matching index storage info.
		for (auto const &elem : table_info->GetIndexStorageInfo()) {
			if (elem.name == index.name) {
				index_storage_info = elem;
				break;
			}
		}
	}

	D_ASSERT(index_storage_info.IsValid());
	D_ASSERT(!index_storage_info.name.empty());

	// Create an unbound index and add it to the table.
	auto unbound_index = make_uniq<UnboundIndex>(std::move(create_info), index_storage_info,
	                                             TableIOManager::Get(data_table), data_table.db);
	table_info->GetIndexes().AddIndex(std::move(unbound_index));
}